

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaPErrMemory(xmlSchemaParserCtxtPtr ctxt)

{
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  
  if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
    channel = (xmlGenericErrorFunc)0x0;
    schannel = (xmlStructuredErrorFunc)0x0;
    data = (void *)0x0;
  }
  else {
    ctxt->nberrors = ctxt->nberrors + 1;
    ctxt->err = 2;
    data = ctxt->errCtxt;
    channel = ctxt->error;
    schannel = ctxt->serror;
  }
  xmlRaiseMemoryError(schannel,channel,data,0x10,(xmlError *)0x0);
  return;
}

Assistant:

static void
xmlSchemaPErrMemory(xmlSchemaParserCtxtPtr ctxt)
{
    xmlGenericErrorFunc channel = NULL;
    xmlStructuredErrorFunc schannel = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        ctxt->nberrors++;
        ctxt->err = XML_ERR_NO_MEMORY;
        channel = ctxt->error;
        schannel = ctxt->serror;
        data = ctxt->errCtxt;
    }

    xmlRaiseMemoryError(schannel, channel, data, XML_FROM_SCHEMASP, NULL);
}